

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O1

int lj_cparse_case(GCstr *str,char *match)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  ulong __n;
  int iVar4;
  char *__s1;
  
  cVar2 = *match;
  if (cVar2 != '\0') {
    uVar1 = str->len;
    iVar4 = 0;
    do {
      __s1 = match + 1;
      __n = (ulong)(uint)(int)cVar2;
      if ((uVar1 == (int)cVar2) && (iVar3 = bcmp(__s1,str + 1,__n), iVar3 == 0)) {
        return iVar4;
      }
      iVar4 = iVar4 + 1;
      cVar2 = __s1[__n];
      match = __s1 + __n;
    } while (cVar2 != '\0');
  }
  return -1;
}

Assistant:

int lj_cparse_case(GCstr *str, const char *match)
{
  MSize len;
  int n;
  for  (n = 0; (len = (MSize)*match++); n++, match += len) {
    if (str->len == len && !memcmp(match, strdata(str), len))
      return n;
  }
  return -1;
}